

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# giaIf.c
# Opt level: O1

int Gia_ManFromIfLogicCreateLutSpecial
              (Gia_Man_t *pNew,word *pRes,Vec_Int_t *vLeaves,Vec_Int_t *vLeavesTemp,
              Vec_Int_t *vCover,Vec_Int_t *vMapping,Vec_Int_t *vMapping2,Vec_Int_t *vPacking)

{
  uint uVar1;
  uint uVar2;
  word wVar3;
  uint uVar4;
  uint uVar5;
  long lVar6;
  word local_38;
  
  wVar3 = If_CutPerformDerive07
                    ((If_Man_t *)0x0,(uint *)pRes,vLeaves->nSize,vLeaves->nSize,(char *)0x0);
  vLeavesTemp->nSize = 0;
  lVar6 = 0x10;
  do {
    uVar1 = (uint)(wVar3 >> ((byte)lVar6 & 0x3f));
    uVar4 = uVar1 & 7;
    if ((uVar4 != 6) || (vLeaves->nSize != 5)) {
      if (vLeaves->nSize <= (int)uVar4) goto LAB_00210137;
      Vec_IntPush(vLeavesTemp,vLeaves->pArray[uVar1 & 7]);
    }
    lVar6 = lVar6 + 4;
  } while (lVar6 != 0x20);
  local_38 = (wVar3 & 0xffff) * 0x1000100010001;
  uVar1 = Gia_ManFromIfLogicCreateLut(pNew,&local_38,vLeavesTemp,vCover,vMapping,vMapping2);
  vLeavesTemp->nSize = 0;
  lVar6 = 0x30;
  do {
    uVar2 = (uint)(wVar3 >> ((byte)lVar6 & 0x3f));
    uVar5 = uVar2 & 7;
    uVar4 = uVar1;
    if (uVar5 == 7) {
LAB_0021009a:
      Vec_IntPush(vLeavesTemp,uVar4);
    }
    else if ((uVar5 != 6) || (vLeaves->nSize != 5)) {
      if (vLeaves->nSize <= (int)uVar5) {
LAB_00210137:
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1a9,"int Vec_IntEntry(Vec_Int_t *, int)");
      }
      uVar4 = vLeaves->pArray[uVar2 & 7];
      goto LAB_0021009a;
    }
    lVar6 = lVar6 + 4;
    if (lVar6 == 0x40) {
      local_38 = (wVar3 >> 0x20 & 0xffff) * 0x1000100010001;
      uVar4 = Gia_ManFromIfLogicCreateLut(pNew,&local_38,vLeavesTemp,vCover,vMapping,vMapping2);
      Vec_IntPush(vPacking,2);
      if ((-1 < (int)uVar1) && (Vec_IntPush(vPacking,uVar1 >> 1), -1 < (int)uVar4)) {
        Vec_IntPush(vPacking,uVar4 >> 1);
        if (0 < vPacking->nSize) {
          *vPacking->pArray = *vPacking->pArray + 1;
          return uVar4;
        }
        __assert_fail("i >= 0 && i < p->nSize",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                      ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
      }
      __assert_fail("Lit >= 0",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/util/abc_global.h"
                    ,0x12f,"int Abc_Lit2Var(int)");
    }
  } while( true );
}

Assistant:

int Gia_ManFromIfLogicCreateLutSpecial( Gia_Man_t * pNew, word * pRes, Vec_Int_t * vLeaves, Vec_Int_t * vLeavesTemp, Vec_Int_t * vCover, Vec_Int_t * vMapping, Vec_Int_t * vMapping2, Vec_Int_t * vPacking )
{
    word z = If_CutPerformDerive07( NULL, (unsigned *)pRes, Vec_IntSize(vLeaves), Vec_IntSize(vLeaves), NULL );
    word Truth;
    int i, iObjLit1, iObjLit2;
    // create first LUT
    Vec_IntClear( vLeavesTemp );
    for ( i = 0; i < 4; i++ )
    {
        int v = (int)((z >> (16+(i<<2))) & 7);
        if ( v == 6 && Vec_IntSize(vLeaves) == 5 )
            continue;
        Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, v) );
    }
    Truth = (z & 0xffff);
    Truth |= (Truth << 16);
    Truth |= (Truth << 32);
    iObjLit1 = Gia_ManFromIfLogicCreateLut( pNew, &Truth, vLeavesTemp, vCover, vMapping, vMapping2 );
    // create second LUT
    Vec_IntClear( vLeavesTemp );
    for ( i = 0; i < 4; i++ )
    {
        int v =  (int)((z >> (48+(i<<2))) & 7);
        if ( v == 6 && Vec_IntSize(vLeaves) == 5 )
            continue;
        if ( v == 7 )
            Vec_IntPush( vLeavesTemp, iObjLit1 );
        else
            Vec_IntPush( vLeavesTemp, Vec_IntEntry(vLeaves, v) );
    }
    Truth = ((z >> 32) & 0xffff);
    Truth |= (Truth << 16);
    Truth |= (Truth << 32);
    iObjLit2 = Gia_ManFromIfLogicCreateLut( pNew, &Truth, vLeavesTemp, vCover, vMapping, vMapping2 );
    // write packing
    Vec_IntPush( vPacking, 2 );
    Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit1) );
    Vec_IntPush( vPacking, Abc_Lit2Var(iObjLit2) );
    Vec_IntAddToEntry( vPacking, 0, 1 );
    return iObjLit2;
}